

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

bool crnlib::rg_etc1::unpack_etc2_color(void *pBlock,uint *pDst_pixels_rgba,bool preserve_alpha)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  byte bVar4;
  ushort uVar5;
  uint c;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ushort uVar11;
  int iVar12;
  byte bVar13;
  undefined1 uVar14;
  uint uVar15;
  byte bVar16;
  int16 dj [3];
  int16 base [3];
  int16 di [3];
  int16 color [3];
  undefined2 local_5e;
  short local_5c;
  short local_5a;
  undefined2 local_58;
  ushort local_56;
  ushort local_54 [2];
  byte abStack_50 [4];
  undefined1 auStack_4c [16];
  short local_3c [6];
  
  bVar3 = unpack_etc1_block(pBlock,pDst_pixels_rgba,preserve_alpha);
  if (bVar3) {
    return true;
  }
  bVar4 = *pBlock;
  bVar13 = ((char)(bVar4 << 5) >> 5) + (bVar4 >> 3);
  if ((bVar13 & 0x20) == 0) {
    bVar16 = *(byte *)((long)pBlock + 1);
    if (((bVar16 >> 3) + ((char)(bVar16 << 5) >> 5) & 0x20) == 0) {
      uVar5 = (ushort)bVar4;
      local_58 = (bVar4 >> 5 & 3) + (uVar5 & 0x7e) * 2;
      uVar11 = (ushort)bVar16;
      local_56 = uVar5 & 1 | (uVar5 & 1) << 7 | uVar11 & 0x7e;
      bVar4 = *(byte *)((long)pBlock + 2);
      bVar13 = *(byte *)((long)pBlock + 3);
      local_54[0] = (uVar11 & 1) * 0x80 + (uVar11 & 1) * 2 + (bVar4 & 0x18) * 4 + (bVar4 & 3) * 8 |
                    bVar4 >> 4 & 1 | bVar13 >> 5 & 0xfffc;
      bVar4 = *(byte *)((long)pBlock + 5);
      bVar16 = *(byte *)((long)pBlock + 6);
      local_3c[0] = ((bVar4 >> 1 & 3 | (bVar4 & 7) << 5) + (ushort)(bVar16 >> 5) * 4) - local_58;
      bVar1 = *(byte *)((long)pBlock + 7);
      local_3c[1] = ((bVar16 >> 4 & 1) + (bVar16 & 0x1f) * 8 + (ushort)(bVar1 >> 6) * 2) - local_56;
      local_3c[2] = ((bVar1 >> 4 & 3) + (bVar1 & 0x3f) * 4) - local_54[0];
      local_5e = (bVar13 >> 5 & 3 | (bVar13 & 1) * 4 + (bVar13 & 0x7c) * 2) - local_58;
      bVar13 = *(byte *)((long)pBlock + 4);
      local_5c = ((ushort)(bVar13 >> 7) | bVar13 & 0xfffe) - local_56;
      local_5a = (((ushort)(bVar4 >> 7) | bVar4 >> 1 & 0xfffc | (bVar13 & 1) << 7) +
                 (bVar13 & 1) * 2) - local_54[0];
      lVar6 = 0;
      do {
        (&local_58)[lVar6] = (&local_58)[lVar6] * 4 + 2;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      iVar10 = 0;
      do {
        lVar6 = 0;
        do {
          sVar2 = (&local_58)[lVar6];
          local_3c[lVar6 + 3] = sVar2;
          (&local_58)[lVar6] = sVar2 + local_3c[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        iVar12 = 0;
        do {
          lVar6 = 0;
          do {
            uVar15 = (uint)local_3c[lVar6 + 3];
            if (0x3fb < (int)uVar15) {
              uVar15 = 0x3fc;
            }
            if ((short)uVar15 < 1) {
              uVar15 = 0;
            }
            *(char *)((long)pDst_pixels_rgba + lVar6) = (char)(uVar15 >> 2);
            local_3c[lVar6 + 3] = local_3c[lVar6 + 3] + (&local_5e)[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          if (!preserve_alpha) {
            *(undefined1 *)((long)pDst_pixels_rgba + 3) = 0xff;
          }
          iVar12 = iVar12 + 1;
          pDst_pixels_rgba = pDst_pixels_rgba + 1;
        } while (iVar12 != 4);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 4);
      return true;
    }
    if ((bVar13 & 0x20) == 0) {
      bVar13 = *(byte *)((long)pBlock + 2);
      bVar16 = *(byte *)((long)pBlock + 1);
      bVar1 = *(byte *)((long)pBlock + 3);
      local_5e = CONCAT11(bVar13 << 5 | bVar4 * '\x02' & 0xe | bVar16 >> 4 & 1 | bVar1 >> 3 & 0x10,
                          bVar13 * '\x02' & 0xf0 | bVar4 >> 3 & 0xf);
      local_5c = CONCAT11(local_5c._1_1_,
                          bVar1 * '\x02' & 0xf0 | bVar16 & 8 | bVar13 >> 7 | bVar16 * '\x02' & 6);
      bVar4 = (bVar1 * '\x02' & 2 | bVar1 & 4) + 1;
      uVar8 = 0;
      do {
        bVar16 = *(byte *)((long)&local_5e + uVar8) & 0xf;
        bVar13 = *(byte *)((long)&local_5e + uVar8) >> 4;
        bVar4 = (bVar16 < bVar13 ^ 7U) & bVar4;
        if (bVar16 != bVar13) break;
        bVar3 = uVar8 < 2;
        uVar8 = uVar8 + 1;
      } while (bVar3);
      bVar4 = *(byte *)((long)&g_etc2_modifier_table + (ulong)bVar4);
      lVar6 = 0;
      do {
        bVar13 = *(byte *)((long)&local_5e + lVar6);
        bVar16 = bVar13 & 0xf | bVar13 << 4;
        uVar15 = (uint)(byte)(bVar13 & 0xf0 | bVar13 >> 4);
        iVar10 = uVar15 - bVar4;
        uVar14 = (undefined1)iVar10;
        if (iVar10 < 1) {
          uVar14 = 0;
        }
        *(undefined1 *)((long)&local_58 + lVar6) = uVar14;
        uVar15 = uVar15 + bVar4;
        uVar14 = (undefined1)uVar15;
        if (0xfe < uVar15) {
          uVar14 = 0xff;
        }
        *(undefined1 *)((long)local_54 + lVar6) = uVar14;
        uVar15 = (uint)bVar16 + (uint)bVar4;
        if (0xfe < uVar15) {
          uVar15 = 0xff;
        }
        iVar10 = (uint)bVar16 - (uint)bVar4;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        abStack_50[lVar6] = (byte)uVar15;
        auStack_4c[lVar6] = (char)iVar10;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      goto LAB_001a00d2;
    }
  }
  local_5e = CONCAT11(*(byte *)((long)pBlock + 1) >> 4 | *(byte *)((long)pBlock + 2) << 4,
                      *(byte *)((long)pBlock + 2) & 0xf0 | bVar4 >> 1 & 0xc | bVar4 & 3);
  bVar4 = *(byte *)((long)pBlock + 3);
  local_5c = CONCAT11(local_5c._1_1_,bVar4 & 0xf0 | *(byte *)((long)pBlock + 1) & 0xf);
  bVar4 = *(byte *)((long)&g_etc2_modifier_table + (ulong)(bVar4 >> 1 & 6 | bVar4 & 1));
  lVar6 = 0;
  do {
    bVar13 = *(byte *)((long)&local_5e + lVar6);
    abStack_50[lVar6] = bVar13 & 0xf | bVar13 << 4;
    bVar13 = bVar13 & 0xf0 | bVar13 >> 4;
    *(byte *)((long)local_54 + lVar6) = bVar13;
    uVar15 = (uint)bVar4;
    iVar10 = bVar13 - uVar15;
    uVar14 = (undefined1)iVar10;
    if (iVar10 < 1) {
      uVar14 = 0;
    }
    uVar15 = bVar13 + uVar15;
    if (0xfe < uVar15) {
      uVar15 = 0xff;
    }
    *(undefined1 *)((long)&local_58 + lVar6) = uVar14;
    auStack_4c[lVar6] = (char)uVar15;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
LAB_001a00d2:
  uVar15 = 0;
  do {
    lVar6 = 0;
    uVar8 = 0;
    do {
      uVar7 = (uint)lVar6 & 4;
      uVar9 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)((*(byte *)((long)pBlock + (7 - (uVar8 >> 1))) >>
                                              (uVar7 | uVar15 & 0x1f) & 1) != 0) +
                                     (*(byte *)((long)pBlock + (5 - (uVar8 >> 1))) >>
                                      ((byte)uVar7 | (byte)uVar15 & 0x1f) & 1) * 2));
      *(undefined1 *)((long)pDst_pixels_rgba + lVar6) = *(undefined1 *)(&local_58 + uVar9 * 2);
      *(undefined1 *)((long)pDst_pixels_rgba + lVar6 + 1) =
           *(undefined1 *)((long)&local_58 + uVar9 * 4 + 1);
      *(char *)((long)pDst_pixels_rgba + lVar6 + 2) = (char)local_54[uVar9 * 2 + -1];
      if (!preserve_alpha) {
        *(undefined1 *)((long)pDst_pixels_rgba + lVar6 + 3) = 0xff;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      lVar6 = lVar6 + 4;
    } while ((int)lVar6 != 0x10);
    uVar15 = uVar15 + 1;
    pDst_pixels_rgba = (uint *)((long)pDst_pixels_rgba + lVar6);
  } while (uVar15 != 4);
  return true;
}

Assistant:

bool unpack_etc2_color(const void* pBlock, unsigned int* pDst_pixels_rgba, bool preserve_alpha) {
  if (unpack_etc1_block(pBlock, pDst_pixels_rgba, preserve_alpha))
    return true;

  color_quad_u8* pDst = reinterpret_cast<color_quad_u8*>(pDst_pixels_rgba);
  const etc1_block& block = *static_cast<const etc1_block*>(pBlock);
  const uint8* B = block.m_bytes;
  const bool rOverflow = ((int8(B[0] << 5) >> 5) + (B[0] >> 3)) & 0x20;
  const bool gOverflow = ((int8(B[1] << 5) >> 5) + (B[1] >> 3)) & 0x20;

  if (rOverflow || gOverflow) {
    color_quad_u8 block_colors[4];
    uint8 unpacked[3];
    if (rOverflow) {
      unpacked[0] = (B[0] & 0x3) | (B[0] >> 1 & 0xC) | (B[2] & 0xF0);
      unpacked[1] = B[1] >> 4 | B[2] << 4;
      unpacked[2] = (B[1] & 0xF) | (B[3] & 0xF0);
      uint8 delta = g_etc2_modifier_table[(B[3] & 1) | (B[3] >> 1 & 6)];
      for (uint c = 0; c < 3; c++) {
        block_colors[2][c] = unpacked[c] << 4 | (unpacked[c] & 0xF);
        block_colors[1][c] = unpacked[c] >> 4 | (unpacked[c] & 0xF0);
        block_colors[0][c] = math::maximum(0, block_colors[1][c] - delta);
        block_colors[3][c] = math::minimum(255, block_colors[1][c] + delta);
      }
    } else {
      unpacked[0] = (B[0] >> 3 & 0xF) | (B[2] << 1 & 0xF0);
      unpacked[1] = (B[1] >> 4 & 0x1) | (B[0] << 1 & 0xE) | (B[3] >> 3 & 0x10) | B[2] << 5;
      unpacked[2] = B[2] >> 7 | (B[1] << 1 & 0x6) | (B[1] & 0x8) | (B[3] << 1 & 0xF0);
      uint8 modifier = (B[3] & 4) | (B[3] << 1 & 2) | 1;
      for (int d = 0, c = 0; !d && c < 3; c++, modifier &= d < 0 ? 6 : 7)
        d = (unpacked[c] & 0xF) - (unpacked[c] >> 4);
      uint8 delta = g_etc2_modifier_table[modifier];
      for (uint c = 0; c < 3; c++) {
        uint8 c0 = unpacked[c] << 4 | (unpacked[c] & 0xF);
        uint8 c1 = unpacked[c] >> 4 | (unpacked[c] & 0xF0);
        block_colors[0][c] = math::maximum(0, c1 - delta);
        block_colors[1][c] = math::minimum(255, c1 + delta);
        block_colors[2][c] = math::minimum(255, c0 + delta);
        block_colors[3][c] = math::maximum(0, c0 - delta);
      }
    }
    for (uint i = 0; i < 4; i++) {
      for (uint j = 0; j < 4; j++, pDst++) {
        pDst->set_rgb(block_colors[block.get_selector(j, i)]);
        if (!preserve_alpha)
          pDst->a = 255;
      }
    }
  } else {
    int16 base[3], dj[3], di[3], color[3];
    base[0] = (B[0] << 1 & 0xFC) | (B[0] >> 5 & 3);
    base[1] = (B[0] << 7 & 0x80) | (B[1] & 0x7E) | (B[0] & 1);
    base[2] = (B[1] << 7 & 0x80) | (B[2] << 2 & 0x60) | (B[2] << 3 & 0x18) | (B[3] >> 5 & 4) | (B[1] << 1 & 2) | (B[2] >> 4 & 1);
    di[0] = ((B[5] << 5 & 0xE0) | (B[6] >> 3 & 0x1C) | (B[5] >> 1 & 0x3)) - base[0];
    di[1] = ((B[6] << 3 & 0xF8) | (B[7] >> 5 & 0x6) | (B[6] >> 4 & 0x1)) - base[1];
    di[2] = ((B[7] << 2 & 0xFC) | (B[7] >> 4 & 0x3)) - base[2];
    dj[0] = ((B[3] << 1 & 0xF8) | (B[3] << 2 & 0x4) | (B[3] >> 5 & 0x3)) - base[0];
    dj[1] = ((B[4] & 0xFE) | B[4] >> 7) - base[1];
    dj[2] = ((B[4] << 7 & 0x80) | (B[5] >> 1 & 0x7C) | (B[4] << 1 & 0x2) | B[5] >> 7) - base[2];
    for (uint c = 0; c < 3; c++)
      base[c] = (base[c] << 2) + 2;
    for (uint i = 0; i < 4; i++) {
      for (uint c = 0; c < 3; base[c] += di[c], c++)
        color[c] = base[c];
      for (uint j = 0; j < 4; j++, pDst++) {
        for (uint c = 0; c < 3; color[c] += dj[c], c++)
          pDst->c[c] = math::clamp<int16>(color[c], 0, 1020) >> 2;
        if (!preserve_alpha)
          pDst->a = 255;
      }
    }
  }
  return true;
}